

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureVectorizer.pb.cc
# Opt level: O0

void CoreML::Specification::protobuf_FeatureVectorizer_2eproto::TableStruct::Shutdown(void)

{
  google::protobuf::internal::
  ExplicitlyConstructed<CoreML::Specification::FeatureVectorizer_InputColumn>::Shutdown
            ((ExplicitlyConstructed<CoreML::Specification::FeatureVectorizer_InputColumn> *)
             _FeatureVectorizer_InputColumn_default_instance_);
  google::protobuf::internal::ExplicitlyConstructed<CoreML::Specification::FeatureVectorizer>::
  Shutdown((ExplicitlyConstructed<CoreML::Specification::FeatureVectorizer> *)
           _FeatureVectorizer_default_instance_);
  return;
}

Assistant:

void TableStruct::Shutdown() {
  _FeatureVectorizer_InputColumn_default_instance_.Shutdown();
  _FeatureVectorizer_default_instance_.Shutdown();
}